

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O3

void trdmain1(errcxdef *ec,int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  appctxdef *appctx_00;
  bool bVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int prv;
  uint uVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *filename;
  char *pcVar12;
  FILE *pFVar13;
  long lVar14;
  osfildef *swapfp;
  mcmcx1def *pmVar15;
  mcmcxdef *ctx;
  objucxdef *undoctx;
  runsdef *prVar16;
  uchar *puVar17;
  osfildef **ppoVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  char cVar23;
  ushort uVar24;
  bool bVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong swapsize;
  int i;
  char **argp;
  int loadopen;
  objnum preinit;
  uint flags;
  runcxdef runctx;
  fiolcxdef fiolctx;
  supcxdef supctx;
  errdef fr_;
  _func_void_bifcxdef_ptr_int *bif [100];
  voccxdef vocctx;
  char inbuf [4096];
  char infile_abs [4096];
  char infile_path [4096];
  char swapbuf [4096];
  int local_6e8c;
  bool local_6e62;
  bool local_6e61;
  int local_6e58;
  bool local_6e54;
  bool local_6e53;
  char local_6e52;
  char local_6e51;
  ulong local_6e50;
  char *local_6e48;
  char *local_6e40;
  char *local_6e38;
  undefined1 local_6e2b;
  char local_6e2a;
  char local_6e29;
  char **local_6e28;
  ushort local_6e1a;
  ushort local_6e18;
  ushort local_6e16;
  ushort local_6e14;
  ushort local_6e12;
  uint local_6e10;
  uint local_6e0c;
  int local_6e08;
  ushort local_6e02;
  char *local_6e00;
  char *local_6df8;
  uint local_6df0;
  int local_6dec;
  uint local_6de8;
  uint local_6de4;
  uint local_6de0;
  int local_6ddc;
  int local_6dd8;
  uint local_6dd4;
  uint local_6dd0;
  int local_6dcc;
  int local_6dc8;
  int local_6dc4;
  uint local_6dc0;
  int local_6dbc;
  uint local_6db8;
  uint local_6db4;
  uint local_6db0;
  uint local_6dac;
  int local_6da8;
  int local_6da4;
  ulong local_6da0;
  ulong local_6d98;
  ulong local_6d90;
  ulong local_6d88;
  char *local_6d80;
  appctxdef *local_6d78;
  int local_6d70;
  int local_6d6c;
  int local_6d68;
  int local_6d64;
  uint local_6d60;
  uint local_6d5c;
  int local_6d58;
  objnum local_6d52;
  char *local_6d50;
  char *local_6d48;
  char *local_6d40;
  char **local_6d38;
  ulong local_6d30;
  ulong local_6d28;
  ulong local_6d20;
  ulong local_6d18;
  ulong local_6d10;
  ulong local_6d08;
  ulong local_6d00;
  ulong local_6cf8;
  ulong local_6cf0;
  char *local_6ce8;
  char *local_6ce0;
  char *local_6cd8;
  char *local_6cd0;
  char *local_6cc8;
  char *local_6cc0;
  char *local_6cb8;
  ulong local_6cb0;
  ulong local_6ca8;
  ulong local_6ca0;
  ulong local_6c98;
  objucxdef *local_6c90;
  char *local_6c88;
  char **local_6c80;
  long local_6c78;
  char **local_6c70;
  char *local_6c68;
  uchar *local_6c60;
  char *local_6c58;
  ulong local_6c50;
  mcmcx1def *local_6c48;
  char *local_6c40;
  char *local_6c38;
  uint local_6c2c;
  runcxdef local_6c28;
  fiolcxdef local_6b80;
  supcxdef local_6b58;
  errdef local_6b20;
  errcxdef *local_69e8;
  runcxdef *local_69e0;
  undefined8 local_69d8;
  undefined8 uStack_69d0;
  undefined1 local_69c8 [176];
  uint local_6918;
  uint local_6914;
  char *local_6910;
  appctxdef *local_6908;
  re_context local_6900;
  _func_void_bifcxdef_ptr_int *local_6828 [100];
  voccxdef local_6508;
  char local_5348 [4096];
  char local_4348 [4096];
  char local_3348 [4096];
  char local_2348 [4104];
  dbgcxdef local_1340;
  
  local_6da4 = 0;
  local_6d78 = appctx;
  local_6c38 = save_ext;
  out_init();
  local_6e58 = 1;
  local_6e28 = argv + 1;
  local_6c80 = argv;
  if (argc < 2) {
    uVar24 = 60000;
    pcVar12 = (char *)0x0;
    local_6e08 = 0;
    local_6dcc = 0;
    local_6e61 = false;
    local_6e2b = 1;
    local_6e53 = true;
    local_6e62 = true;
    local_6e1a = 60000;
    uVar27 = 0xffff;
    uVar28 = 0x200;
    local_6d90 = 0x200;
    local_6e10 = 2;
    local_6df0 = 2;
    local_6e0c = 2;
    pcVar22 = (char *)0x0;
    local_6d40 = (char *)0x0;
    local_6d48 = (char *)0x0;
    local_6d50 = (char *)0x0;
    local_6dec = 1;
    local_6d98 = 0xffffffff;
    local_6da0 = 0xffffffff;
    uVar19 = 0xffffffff;
    swapsize = 0xffffffff;
    uVar26 = 0xffff;
    uVar21 = 2;
    cVar23 = true;
    filename = pcVar12;
    bVar25 = false;
    bVar1 = local_6e53;
    uVar2 = local_6e1a;
    uVar20 = local_6df0;
    iVar9 = local_6dec;
    iVar10 = local_6dcc;
    pcVar11 = local_6d50;
    pcVar3 = local_6d48;
    pcVar4 = local_6d40;
    bVar5 = true;
    if (argc != 1) goto LAB_001e9b41;
LAB_001e9d3c:
    uVar19 = local_6d98;
    local_6db0 = local_6e10;
    local_6dac = local_6e0c;
    local_6da8 = local_6e08;
    local_6cb0 = local_6da0;
    local_6ca8 = local_6d90;
    if (local_6c80 == (char **)0x0) {
      local_6cc8 = "TRX";
    }
    else {
      local_6cc8 = "TRX";
      if (*local_6c80 != (char *)0x0) {
        local_6cc8 = *local_6c80;
      }
    }
    local_6cc0 = pcVar22;
    local_6cb8 = pcVar12;
    local_6ca0 = uVar26;
    pFVar13 = (FILE *)os_exeseek(local_6cc8,"TGAM");
    if (pFVar13 != (FILE *)0x0) {
      local_6c58 = filename;
      local_6c78 = ftell(pFVar13);
      local_6c68 = (char *)0x0;
      fseek(pFVar13,0,2);
      lVar14 = ftell(pFVar13);
      filename = local_6c58;
      local_6e2a = cVar23;
      fclose(pFVar13);
      cVar23 = local_6e2a;
      if (lVar14 != local_6c78) {
        local_6df8 = local_6cc0;
        local_6c88 = local_6cc8;
        pcVar12 = local_6cb8;
        swapsize = local_6cb0;
        local_6c50 = local_6ca8;
        local_6c98 = local_6ca0;
        pcVar11 = local_6c68;
        local_6d60 = local_6dac;
        local_6d58 = local_6da8;
        local_6d5c = local_6db0;
        goto LAB_001e9f9b;
      }
    }
    if ((local_6d78 != (appctxdef *)0x0) &&
       (local_6d78->get_game_name != (_func_int_void_ptr_char_ptr_size_t *)0x0)) {
      local_6d6c = (*local_6d78->get_game_name)(local_6d78->get_game_name_ctx,local_5348,0x1000);
      local_6df8 = local_6cc0;
      local_6c88 = local_6cc8;
      pcVar12 = local_6cb8;
      swapsize = local_6cb0;
      local_6c50 = local_6ca8;
      local_6c98 = local_6ca0;
      pcVar11 = local_5348;
      local_6d60 = local_6dac;
      local_6d58 = local_6da8;
      local_6d5c = local_6db0;
      if (local_6d6c == 0) {
        trdptf("\n");
        trdptf("(No game has been selected.)\n");
        return;
      }
LAB_001e9f9b:
      pcVar22 = local_6df8;
      swapfp = (osfildef *)0x0;
      local_6e29 = local_6e62;
      local_6e02 = uVar24;
      local_6d80 = pcVar11;
      local_6c40 = pcVar12;
      if ((local_6e61 != false) && (swapsize != 0)) {
        swapfp = os_create_tempfile(local_6df8,local_2348);
        if (pcVar22 == (char *)0x0) {
          pcVar22 = local_2348;
        }
        if (swapfp == (osfildef *)0x0) {
          errsigf(ec,"TADS",0xd);
        }
      }
      if (cVar23 == '\0') {
        cmap_override();
      }
      else {
        iVar10 = cmap_load(filename);
        if (iVar10 != 0) {
          errsigf(ec,"TADS",0x5e3);
        }
      }
      local_6b20.errcode = _setjmp((__jmp_buf_tag *)local_6b20.errbuf);
      if (local_6b20.errcode == 0) {
        local_6b20.errprv = ec->errcxptr;
        ec->errcxptr = &local_6b20;
        pmVar15 = mcmini(uVar19,0x80,swapsize,swapfp,pcVar22,ec);
        undoctx = (objucxdef *)0x0;
        ctx = mcmcini(pmVar15,0x80,fioldobj,&local_6b80,objrevert,(void *)0x0);
        ctx->mcmcxrvc = ctx;
        if (local_6e02 != 0) {
          undoctx = objuini(ctx,local_6e02,vocdundo,vocdusz,&local_6508);
        }
        local_6c90 = undoctx;
        vocini(&local_6508,ec,ctx,&local_6c28,undoctx,100,100,200);
        uVar26 = local_6c50;
        main_voc_ctx = &local_6508;
        prVar16 = (runsdef *)mchalo(ec,local_6c50 * 0x10,"runtime stack");
        puVar17 = mchalo(ec,local_6c98,"runtime heap");
        pcVar11 = local_6d80;
        local_6c60 = puVar17;
        local_6c48 = pmVar15;
        if ((local_6d80 == (char *)0x0) && (pcVar11 = local_6c88, local_6c88 == (char *)0x0)) {
          local_4348[0] = '\0';
        }
        else {
          os_get_abs_filename(local_4348,0x1000,pcVar11);
        }
        os_get_path_name(local_3348,0x1000,local_4348);
        local_6c28.runcxstop = prVar16 + uVar26;
        local_6c28.runcxhtop = local_6c60 + local_6c98;
        local_6c28.runcxundo = local_6c90;
        local_6c28.runcxbcx = &local_69e8;
        local_6c28.runcxbi = local_6828;
        local_6c28.runcxtio = (tiocxdef *)0x0;
        local_6c28.runcxdbg = &local_1340;
        local_6c28.runcxvoc = &local_6508;
        local_6c28.runcxdmd = supcont;
        local_6c28.runcxext = (runxdef *)0x0;
        local_6c28.runcxgamename = local_6d80;
        local_6c28.runcxgamepath = local_3348;
        local_6b58.supcxtab = (tokthdef *)0x0;
        local_6b58.supcxbuf = (uchar *)0x0;
        local_6b58.supcxlen = 0;
        local_1340.dbgcxtio = (tiocxdef *)0x0;
        local_1340.dbgcxtab = (tokthdef *)0x0;
        local_1340.dbgcxflg = 0;
        local_1340.dbgcxlin = (lindef *)0x0;
        local_1340.dbgcxfcn = 0;
        local_1340.dbgcxdep = 0;
        local_6c28.runcxerr = ec;
        local_6c28.runcxmem = ctx;
        local_6c28.runcxstk = prVar16;
        local_6c28.runcxsp = prVar16;
        local_6c28.runcxbp = prVar16;
        local_6c28.runcxheap = puVar17;
        local_6c28.runcxhp = puVar17;
        local_6c28.runcxdmc = &local_6b58;
        local_6b58.supcxerr = ec;
        local_6b58.supcxmem = ctx;
        local_6b58.supcxvoc = local_6c28.runcxvoc;
        local_6b58.supcxrun = &local_6c28;
        local_1340.dbgcxmem = ctx;
        local_1340.dbgcxerr = ec;
        memset(local_69c8,0,0x1a0);
        appctx_00 = local_6d78;
        local_69d8 = 0;
        uStack_69d0 = 0;
        local_6908 = local_6d78;
        local_6918 = local_6d60;
        local_6914 = local_6d5c;
        local_6910 = local_6c38;
        local_69e8 = ec;
        local_69e0 = &local_6c28;
        re_init(&local_6900,ec);
        supbif(&local_6b58,local_6828,100);
        runistat(&local_6508,&local_6c28,(tiocxdef *)0x0);
        fiord(ctx,&local_6508,(tokcxdef *)0x0,local_6d80,local_6c88,&local_6b80,&local_6d52,
              &local_6c2c,(tokpdef *)0x0,(uchar **)0x0,(uint *)0x0,(uint *)0x0,local_6d58,appctx_00,
              *local_6c80);
        local_6da4 = 1;
        plygo(&local_6c28,&local_6508,(tiocxdef *)0x0,local_6d52,local_6c40);
        fiorcls(&local_6b80);
        if (local_6e29 == '\0') {
          trdptf("[press a key to exit]");
          os_waitc();
          trdptf("\n");
        }
        pmVar15 = local_6c48;
        trd_close_swapfile(&local_6c28);
        qasclose();
        ec->errcxptr = local_6b20.errprv;
        main_voc_ctx = (voccxdef *)0x0;
        vocterm(&local_6508);
        if (local_6c90 != (objucxdef *)0x0) {
          objuterm(local_6c90);
        }
        mcmcterm(ctx);
        mcmterm(pmVar15);
        return;
      }
      goto LAB_001ea535;
    }
  }
  else {
    if (**local_6e28 == '-') {
      iVar10 = 1;
      uVar7 = 0x200;
      pcVar22 = (char *)0x0;
      local_6dbc = 0;
      local_6ddc = 0;
      bVar25 = false;
      local_6dc8 = 0;
      local_6d30 = 0xffffffff;
      local_6e18 = 60000;
      local_6de4 = 0xffff;
      swapsize = 0xffffffff;
      uVar21 = 2;
      uVar20 = 2;
      filename = pcVar22;
      pcVar11 = pcVar22;
      local_6ce8 = *local_6e28;
      do {
        pcVar12 = local_6ce8;
        uVar19 = local_6d30;
        prv = local_6dbc;
        local_6e8c = local_6dc8;
        iVar9 = local_6ddc;
        uVar8 = local_6de4;
        uVar24 = local_6e18;
        local_6e50 = swapsize;
        local_6e48 = pcVar11;
        local_6e40 = pcVar22;
        switch(local_6ce8[1]) {
        case 'c':
          pcVar11 = local_6ce8 + 1;
          iVar6 = strcmp(pcVar11,"ctab");
          if (iVar6 == 0) {
            filename = cmdarg(ec,&local_6e28,&local_6e58,argc,4,trdusage);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            break;
          }
          local_6d64 = strcmp(pcVar11,"ctab-");
          bVar25 = true;
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          pcVar22 = local_6e40;
          iVar6 = local_6d64;
          goto joined_r0x001e9392;
        case 'd':
          local_6e38 = filename;
          iVar6 = strnicmp(local_6ce8,"-double",7);
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          filename = local_6e38;
          if (iVar6 == 0) {
            local_6d68 = cmdtog(ec,iVar10,pcVar12,6,trdusage);
            out_set_doublespace(local_6d68);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
            iVar10 = local_6d68;
          }
          break;
        default:
          goto switchD_001e8fb9_caseD_65;
        case 'i':
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          qasopn(pcVar11,1);
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          break;
        case 'l':
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          pFVar13 = fopen(pcVar11,"w");
          ppoVar18 = &logfp;
          goto LAB_001e94af;
        case 'm':
          if (local_6ce8[2] == 'h') {
            pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,2,trdusage);
            uVar8 = atoi(pcVar11);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
          }
          else if (local_6ce8[2] == 's') {
            local_6e38 = filename;
            pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,2,trdusage);
            uVar7 = atoi(pcVar11);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          else {
            local_6e38 = filename;
            pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
            uVar19 = atol(pcVar11);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          break;
        case 'n':
          local_6d70 = strcmp(local_6ce8,"-nobanner");
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          pcVar22 = local_6e40;
          iVar6 = local_6d70;
joined_r0x001e9392:
          local_6e50 = swapsize;
          local_6e48 = pcVar11;
          local_6e40 = pcVar22;
          if (iVar6 == 0) goto LAB_001e961e;
          goto switchD_001e8fb9_caseD_65;
        case 'o':
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          pFVar13 = fopen(pcVar11,"w");
          ppoVar18 = &cmdfile;
LAB_001e94af:
          *ppoVar18 = (osfildef *)pFVar13;
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          break;
        case 'p':
          local_6e38 = filename;
          iVar6 = stricmp(local_6ce8,"-plain");
          if (iVar6 == 0) {
            os_plain();
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          else {
            prv = cmdtog(ec,prv,pcVar12,1,trdusage);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          break;
        case 'r':
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          swapsize = local_6e50;
          break;
        case 's':
          local_6e38 = filename;
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          cVar23 = *pcVar11;
          if (cVar23 == 0x3f) {
LAB_001ea596:
            trdusage_show_range(ec,0xc4e,0xc55);
            errsigf(ec,"TADS",0x5dc);
          }
          uVar20 = (int)cVar23 - 0x30;
          uVar21 = (int)pcVar11[1] - 0x30;
          if (pcVar11[1] == '\0') {
            uVar21 = uVar20;
          }
          if (((byte)(cVar23 - 0x35U) < 0xfb) || (4 < uVar21)) goto LAB_001ea596;
          swapsize = local_6e50;
          pcVar11 = local_6e48;
          filename = local_6e38;
          if ((local_6d78 != (appctxdef *)0x0) &&
             (local_6d78->set_io_safety_level != (_func_void_void_ptr_int_int *)0x0)) {
            (*local_6d78->set_io_safety_level)(local_6d78->io_safety_level_ctx,uVar20,uVar21);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          break;
        case 't':
          cVar23 = local_6ce8[2];
          if (cVar23 == 's') {
            pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,2,trdusage);
            swapsize = atol(pcVar11);
            pcVar11 = local_6e48;
            break;
          }
          if (cVar23 == 'p') {
            iVar9 = cmdtog(ec,local_6ddc,local_6ce8,2,trdusage);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            break;
          }
          if (cVar23 == 'f') {
            local_6e38 = filename;
            pcVar22 = cmdarg(ec,&local_6e28,&local_6e58,argc,2,trdusage);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          else {
            local_6e38 = filename;
            local_6e8c = cmdtog(ec,local_6dc8,local_6ce8,1,trdusage);
            swapsize = local_6e50;
            pcVar11 = local_6e48;
            filename = local_6e38;
          }
          goto LAB_001e961e;
        case 'u':
          pcVar11 = cmdarg(ec,&local_6e28,&local_6e58,argc,1,trdusage);
          iVar6 = atoi(pcVar11);
          uVar24 = (ushort)iVar6;
          swapsize = local_6e50;
          pcVar11 = local_6e48;
        }
        pcVar22 = local_6e40;
LAB_001e961e:
        local_6e28 = local_6e28 + 1;
        local_6e58 = local_6e58 + 1;
        local_6e14 = uVar24;
        local_6dd4 = uVar7;
        local_6dd0 = uVar8;
        local_6db8 = uVar20;
        local_6db4 = uVar21;
        local_6d08 = uVar19;
        local_6cf0 = swapsize;
        local_6ce0 = pcVar11;
        local_6cd8 = filename;
        local_6cd0 = pcVar22;
        if (argc <= local_6e58) break;
        local_6ce8 = *local_6e28;
        local_6dc8 = local_6e8c;
        local_6e18 = uVar24;
        local_6de4 = uVar8;
        local_6ddc = iVar9;
        local_6dbc = prv;
        local_6d30 = uVar19;
      } while (*local_6ce8 == '-');
      local_6e54 = local_6e8c != 0;
      cVar23 = !bVar25;
      iVar10 = (uint)(iVar9 != 0) * 2;
      local_6e62 = prv == 0;
      uVar28 = (ulong)uVar7;
      uVar27 = (ulong)uVar8;
      local_6d38 = local_6e28;
    }
    else {
      uVar20 = 2;
      uVar28 = 0x200;
      uVar27 = 0xffff;
      uVar24 = 60000;
      cVar23 = true;
      pcVar22 = (char *)0x0;
      iVar10 = 0;
      local_6e54 = false;
      local_6e62 = true;
      uVar19 = 0xffffffff;
      swapsize = 0xffffffff;
      uVar21 = 2;
      pcVar11 = pcVar22;
      filename = pcVar22;
      local_6d38 = local_6e28;
    }
    local_6e61 = local_6e54;
    local_6c70 = local_6d38;
    bVar25 = local_6e54;
    bVar1 = (bool)cVar23;
    local_6e28 = local_6d38;
    uVar2 = uVar24;
    local_6e00 = pcVar11;
    iVar9 = local_6e58;
    pcVar3 = filename;
    pcVar4 = pcVar22;
    bVar5 = local_6e62;
    if (local_6e58 == argc) {
      local_6d88 = uVar27;
      if (pcVar11 == (char *)0x0) {
        pcVar12 = (char *)0x0;
        local_6e0c = uVar20;
        local_6e08 = iVar10;
        local_6d98 = uVar19;
        local_6d90 = uVar28;
      }
      else {
        local_6e16 = uVar24;
        local_6dc4 = iVar10;
        local_6dc0 = uVar20;
        local_6d20 = uVar19;
        local_6d10 = uVar28;
        iVar10 = fiorso_getgame(pcVar11,local_5348,0x1000);
        uVar24 = local_6e16;
        if (iVar10 != 0) {
          local_6c88 = (char *)0x0;
          pcVar12 = local_6e00;
          uVar19 = local_6d20;
          local_6c50 = local_6d10;
          local_6c98 = local_6d88;
          pcVar11 = local_5348;
          local_6d60 = local_6dc0;
          local_6d58 = local_6dc4;
          local_6d5c = uVar21;
          local_6df8 = pcVar22;
          goto LAB_001e9f9b;
        }
        local_6d98 = local_6d20;
        local_6d90 = local_6d10;
        local_6e08 = local_6dc4;
        local_6e0c = local_6dc0;
        pcVar12 = local_6e00;
      }
      uVar26 = local_6d88;
      local_6e10 = uVar21;
      local_6da0 = swapsize;
      goto LAB_001e9d3c;
    }
LAB_001e9b41:
    local_6e52 = bVar5;
    local_6d40 = pcVar4;
    local_6d48 = pcVar3;
    local_6d50 = pcVar11;
    local_6dcc = iVar10;
    local_6dec = iVar9;
    local_6df0 = uVar20;
    local_6e1a = uVar2;
    local_6e53 = bVar1;
    pcVar22 = local_6d40;
    filename = local_6d48;
    pcVar12 = local_6d50;
    cVar23 = local_6e53;
    local_6e12 = local_6e1a;
    local_6dd8 = local_6dcc;
    local_6de0 = local_6df0;
    local_6e58 = local_6dec;
    local_6e51 = bVar25;
    local_6de8 = uVar21;
    local_6d28 = swapsize;
    local_6d18 = uVar28;
    local_6d00 = uVar27;
    local_6cf8 = uVar19;
    if (local_6dec + 1 == argc) {
      pcVar11 = *local_6e28;
      iVar10 = access(pcVar11,0);
      if (iVar10 != 0) {
        strcpy(local_5348,pcVar11);
        os_defext(local_5348,"gam");
        pcVar11 = local_5348;
      }
      local_6c88 = (char *)0x0;
      local_6df8 = pcVar22;
      uVar19 = local_6cf8;
      swapsize = local_6d28;
      local_6c50 = local_6d18;
      local_6c98 = local_6d00;
      uVar24 = local_6e12;
      local_6d60 = local_6de0;
      local_6e62 = (bool)local_6e52;
      local_6d58 = local_6dd8;
      local_6d5c = local_6de8;
      local_6e61 = (bool)local_6e51;
      goto LAB_001e9f9b;
    }
  }
switchD_001e8fb9_caseD_65:
  trdusage(ec);
LAB_001ea535:
  ec->errcxptr = local_6b20.errprv;
  trd_close_swapfile(&local_6c28);
  if (local_6da4 != 0) {
    fiorcls(&local_6b80);
  }
  main_voc_ctx = (voccxdef *)0x0;
  vocterm(&local_6508);
  errrse1(ec,&local_6b20);
}

Assistant:

static void trdmain1(errcxdef *ec, int argc, char *argv[],
                     appctxdef *appctx, char *save_ext)
{
    osfildef  *swapfp = (osfildef *)0;
    runcxdef   runctx;
    bifcxdef   bifctx;
    voccxdef   vocctx;
    void     (*bif[100])(struct bifcxdef *, int);
    mcmcxdef  *mctx = 0;
    mcmcx1def *globalctx = 0;
    dbgcxdef   dbg;
    supcxdef   supctx;
    char      *swapname = 0;
    char       swapbuf[OSFNMAX];
    char     **argp;
    char      *arg;
    char      *infile;
    char       infile_abs[OSFNMAX];      /* fully-qualified input file name */
    char       infile_path[OSFNMAX];         /* absolute path to input file */
    char      *exefile;            /* try with executable file if no infile */
    ulong      swapsize = 0xffffffffL;        /* allow unlimited swap space */
    int        swapena = OS_DEFAULT_SWAP_ENABLED;      /* swapping enabled? */
    int        i;
    int        pause = FALSE;                 /* pause after finishing game */
    fiolcxdef  fiolctx;
    noreg int  loadopen = FALSE;
    char       inbuf[OSFNMAX];
    ulong      cachelimit = 0xffffffff;
    ushort     undosiz = TRD_UNDOSIZ;      /* default undo context size 16k */
    objucxdef *undoptr = 0;
    uint       flags;         /* flags used to write the file we're reading */
    objnum     preinit;         /* preinit object, if we need to execute it */
    uint       heapsiz = TRD_HEAPSIZ;
    uint       stksiz = TRD_STKSIZ;
    runsdef   *mystack;
    uchar     *myheap;
    extern osfildef *cmdfile;     /* hacky v1 qa interface - command log fp */
    extern osfildef *logfp;        /* hacky v1 qa interface - output log fp */
    int        preload = FALSE;              /* TRUE => preload all objects */
    ulong      totsize;
    extern voccxdef *main_voc_ctx;
    int        safety_read, safety_write;          /* file I/O safety level */
    char      *restore_file = 0;                    /* .SAV file to restore */
    char      *charmap = 0;                           /* character map file */
    int        charmap_none;       /* explicitly do not use a character set */
	int        doublespace = TRUE;        /* formatter double-space setting */
    
    NOREG((&loadopen))

    /* initialize the output formatter */
    out_init();

    /* set safety level to 2 by default - read any/write current dir only */
    safety_read = safety_write = 2;

    /* no -ctab- yet */
    charmap_none = FALSE;

    /* parse arguments */
    for (i = 1, argp = argv + 1 ; i < argc ; ++argp, ++i)
    {
        arg = *argp;
        if (*arg == '-')
        {
            switch(*(arg+1))
            {
            case 'c':
                if (!strcmp(arg+1, "ctab"))
                {
                    /* get the character mapping table */
                    charmap = cmdarg(ec, &argp, &i, argc, 4, trdusage);
                }
                else if (!strcmp(arg+1, "ctab-"))
                {
                    /* use the default mapping */
                    charmap_none = TRUE;
                }
                else
                    trdusage(ec);
                break;
                     
            case 'r':
                /* restore a game */
                restore_file = cmdarg(ec, &argp, &i, argc, 1, trdusage);
                break;
                
            case 'i':
                qasopn(cmdarg(ec, &argp, &i, argc, 1, trdusage), TRUE);
                break;
                
            case 'o':
                cmdfile = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                  OSFTCMD);
                break;
                
            case 'l':
                logfp = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                OSFTCMD);
                break;

            case 'p':
                if (!stricmp(arg, "-plain"))
                {
                    os_plain();
                    break;
                }
                pause = cmdtog(ec, pause, arg, 1, trdusage);
                break;

            case 'd':
                if (!strnicmp(arg, "-double", 7))
                {
                    /* get the argument value */
                    doublespace = cmdtog(ec, doublespace, arg, 6, trdusage);

                    /* set the double-space mode in the formatter */
                    out_set_doublespace(doublespace);
                    break;
                }
                break;

            case 's':
                {
                    char *p;

                    /* get the option */
                    p = cmdarg(ec, &argp, &i, argc, 1, trdusage);

                    /* if they're asking for help, display detailed usage */
                    if (*p == '?')
                        trdusage_s(ec);

                    /* get the safety level from the argument */
                    safety_read = *p - '0';
                    safety_write = (*(p+1) != '\0' ? *(p+1) - '0' :
                                    safety_read);

                    /* range-check the values */
                    if (safety_read < 0 || safety_read > 4
                        || safety_write < 0 || safety_write > 4)
                        trdusage_s(ec);

                    /* tell the host system about the setting */
                    if (appctx != 0 && appctx->set_io_safety_level != 0)
                        (*appctx->set_io_safety_level)
                            (appctx->io_safety_level_ctx,
                             safety_read, safety_write);
                }
                break;
                
            case 'm':
                switch(*(arg + 2))
                {
                case 's':
                    stksiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'h':
                    heapsiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                default:
                    cachelimit = atol(cmdarg(ec, &argp, &i, argc, 1,
                                             trdusage));
                    break;
                }
				break;

			case 'n':
				/* 
				 *   -nobanner was already parsed and handled by our caller,
				 *   but it's still in the argument list, so just skip it;
				 *   anything else starting with -n is invalid
				 */
				if (strcmp(arg, "-nobanner") != 0)
					trdusage(ec);
				break;

            case 't':
                /* swap file options:  -tf file, -ts size, -t- (no swap) */
                switch(*(arg+2))
                {
                case 'f':
                    swapname = cmdarg(ec, &argp, &i, argc, 2, trdusage);
                    break;
                    
                case 's':
                    swapsize = atol(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'p':
                    preload = cmdtog(ec, preload, arg, 2, trdusage);
                    break;
                    
                default:
                    swapena = cmdtog(ec, swapena, arg, 1, trdusage);
                    break;
                }
                break;
                
            case 'u':
                undosiz = atoi(cmdarg(ec, &argp, &i, argc, 1, trdusage));
                break;
                
            default:
                trdusage(ec);
            }
        }
        else break;
    }

    /* presume we won't take the .gam from the application executable */
    exefile = 0;

    /* get input name argument, and make sure it's the last argument */
    if (i == argc)
    {
        osfildef *fp;
        ulong     curpos;
        ulong     endpos;
        int       use_exe;

        /*
         *   There's no input name argument, so we need to find the game
         *   to play some other way.  First, check to see if we have a
         *   game to restore, and if so whether it has the .GAM name
         *   encoded into it.  Next, look to see if there's a game
         *   attached to the executable file; if so, use it.  If not, see
         *   if the host system wants to provide a name through its
         *   callback.  
         */
        
        /* presume we won't find a game attached to the executable file */
        infile = 0;
        use_exe = FALSE;

        /* 
         *   see if we have a saved game to restore, and it specifies the
         *   GAM file that saved it 
         */
        if (restore_file != 0)
        {
            /* try getting the game name from the restore file */
            if (fiorso_getgame(restore_file, inbuf, sizeof(inbuf)))
            {
                /* got it - use this file */
                infile = inbuf;
            }
        }
        
        /* 
         *   it that didn't work, try to read from os-dependent part of
         *   program being executed 
         */
        if (infile == 0)
        {
            /* try opening the executable file */
            exefile = (argv && argv[0] ? argv[0] : "TRX");
            fp = os_exeseek(exefile, "TGAM");
            if (fp != 0)
            {
                /* see if there's a game file attached to the executable */
                curpos = osfpos(fp);
                osfseek(fp, 0L, OSFSK_END);
                endpos = osfpos(fp);
                osfcls(fp);
                
                /* if we found it, use it */
                if (endpos != curpos)
                    use_exe = TRUE;
            }
        }
            
        /* 
         *   if we didn't find a game in the executable, try the host
         *   system callback 
         */
        if (infile == 0 && !use_exe)
        {
            /* 
             *   ask the host system callback what to do - if we don't
             *   have a host system callback, or the callback 
             */
            if (appctx != 0 && appctx->get_game_name != 0)
            {
                /* call the host system callback */
                if ((*appctx->get_game_name)(appctx->get_game_name_ctx,
                                             inbuf, sizeof(inbuf)))
                {
                    /* the host system provided a name - use it */
                    infile = inbuf;
                }
                else
                {
                    /* 
                     *   the host didn't provide a name - simply display a
                     *   message indicating that no game file has been
                     *   chosen, and return 
                     */
                    trdptf("\n");
                    trdptf("(No game has been selected.)\n");
                    return;
                }
            }
            else
            {
                /* 
                 *   we've run out of ways to get a filename - give the
                 *   user the usage message and quit 
                 */
                trdusage(ec);
            }
        }
    }
    else
    {
        infile = *argp;
        if (i + 1 != argc)
            trdusage(ec);

#ifndef OS_HATES_EXTENSIONS
        /*
         *   If original name exists, use it; otherwise, try adding .GAM.
         *   Note that this code is ifdef'd so that platforms that don't
         *   use filename extensions in the manner conventional for DOS
         *   and Unix won't use this code. 
         */
        if (osfacc(infile))
        {
            strcpy(inbuf, infile);
            os_defext(inbuf, "gam");
            infile = inbuf;
        }
#endif /* !defined(OS_HATES_EXTENSIONS) */
    }
    
    /* open up the swap file */
    if (swapena && swapsize)
    {
        swapfp = os_create_tempfile(swapname, swapbuf);
        if (swapname == 0) swapname = swapbuf;
        if (swapfp == 0) errsig(ec, ERR_OPSWAP);
    }
    
    /* load the character map */
    if (charmap_none)
        cmap_override();
    else if (cmap_load(charmap))
        errsig(ec, ERR_INVCMAP);

    ERRBEGIN(ec)

    /* initialize cache manager context */
    globalctx = mcmini(cachelimit, 128, swapsize, swapfp, swapname, ec);
    mctx = mcmcini(globalctx, 128, fioldobj, &fiolctx,
                   objrevert, (void *)0);
    mctx->mcmcxrvc = mctx;

    /* set up an undo context */
    if (undosiz)
        undoptr = objuini(mctx, undosiz, vocdundo, vocdusz, &vocctx);
    else
        undoptr = (objucxdef *)0;

    /* set up vocabulary context */
    vocini(&vocctx, ec, mctx, &runctx, undoptr, 100, 100, 200);

    /*
     *   save a pointer to the voc context globally, so that certain
     *   external routines (such as Unix-style signal handlers) can reach
     *   it 
     */
    main_voc_ctx = &vocctx;
    
    /* allocate stack and heap */
    totsize = (ulong)stksiz * (ulong)sizeof(runsdef);
    if (totsize != (size_t)totsize)
        errsig1(ec, ERR_STKSIZE, ERRTINT, (uint)(65535/sizeof(runsdef)));
    mystack = (runsdef *)mchalo(ec, (size_t)totsize, "runtime stack");
    myheap = mchalo(ec, heapsiz, "runtime heap");

    /* get the absolute path for the input file */
    if (infile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), infile);
    else if (exefile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), exefile);
    else
        infile_abs[0] = '\0';
    os_get_path_name(infile_path, sizeof(infile_path), infile_abs);

    /* set up execution context */
    runctx.runcxerr = ec;
    runctx.runcxmem = mctx;
    runctx.runcxstk = mystack;
    runctx.runcxstop = &mystack[stksiz];
    runctx.runcxsp = mystack;
    runctx.runcxbp = mystack;
    runctx.runcxheap = myheap;
    runctx.runcxhp = myheap;
    runctx.runcxhtop = &myheap[heapsiz];
    runctx.runcxundo = undoptr;
    runctx.runcxbcx = &bifctx;
    runctx.runcxbi = bif;
    runctx.runcxtio = (tiocxdef *)0;
    runctx.runcxdbg = &dbg;
    runctx.runcxvoc = &vocctx;
    runctx.runcxdmd = supcont;
    runctx.runcxdmc = &supctx;
    runctx.runcxext = 0;
    runctx.runcxgamename = infile;
    runctx.runcxgamepath = infile_path;

    /* set up setup context */
    supctx.supcxerr = ec;
    supctx.supcxmem = mctx;
    supctx.supcxtab = (tokthdef *)0;
    supctx.supcxbuf = (uchar *)0;
    supctx.supcxlen = 0;
    supctx.supcxvoc = &vocctx;
    supctx.supcxrun = &runctx;
    
    /* set up debug context */
    dbg.dbgcxtio = (tiocxdef *)0;
    dbg.dbgcxmem = mctx;
    dbg.dbgcxerr = ec;
    dbg.dbgcxtab = (tokthdef *)0;
    dbg.dbgcxfcn = 0;
    dbg.dbgcxdep = 0;
    dbg.dbgcxflg = 0;
    dbg.dbgcxlin = (lindef *)0;                      /* no line sources yet */
    
    /* set up built-in function context */
    CLRSTRUCT(bifctx);
    bifctx.bifcxerr = ec;
    bifctx.bifcxrun = &runctx;
    bifctx.bifcxtio = (tiocxdef *)0;
    bifctx.bifcxrnd = 0;
    bifctx.bifcxrndset = FALSE;
    bifctx.bifcxappctx = appctx;
    bifctx.bifcxsafetyr = safety_read;
    bifctx.bifcxsafetyw = safety_write;
    bifctx.bifcxsavext = save_ext;

    /* initialize the regular expression parser context */
    re_init(&bifctx.bifcxregex, ec);
    
    /* add the built-in functions, keywords, etc */
    supbif(&supctx, bif, (int)(sizeof(bif)/sizeof(bif[0])));
    
    /* set up status line hack */
    runistat(&vocctx, &runctx, (tiocxdef *)0);

    /* turn on the "busy" cursor before loading */
    os_csr_busy(TRUE);
    
    /* read the game from the binary file */
    fiord(mctx, &vocctx, (struct tokcxdef *)0,
          infile, exefile, &fiolctx, &preinit, &flags,
          (struct tokpdef *)0, (uchar **)0, (uint *)0, (uint *)0,
          (preload ? 2 : 0), appctx, argv[0]);
    loadopen = TRUE;

    /* turn off the "busy" cursor */
    os_csr_busy(FALSE);
    
    /* play the game */
    plygo(&runctx, &vocctx, (tiocxdef *)0, preinit, restore_file);
    
    /* close load file */
    fiorcls(&fiolctx);
    
    if (pause)
    {
        trdptf("[press a key to exit]");
        os_waitc();
        trdptf("\n");
    }
    
    /* close and delete swapfile, if one was opened */
    trd_close_swapfile(&runctx);

    /* make sure the script file is closed, if we have one */
    qasclose();

    ERRCLEAN(ec)
        /* close and delete swapfile, if one was opened */
        trd_close_swapfile(&runctx);
        
        /* close the load file if one was opened */
        if (loadopen)
            fiorcls(&fiolctx);

        /* vocctx is going out of scope - forget the global reference to it */
        main_voc_ctx = 0;

        /* delete the voc context */
        vocterm(&vocctx);

        /* delete the undo context */
        if (undoptr != 0)
            objuterm(undoptr);

        /* release the object cache structures */
        if (mctx != 0)
            mcmcterm(mctx);
        if (globalctx != 0)
            mcmterm(globalctx);
    ERRENDCLN(ec)

    /* vocctx is going out of scope - forget the global reference to it */
    main_voc_ctx = 0;

    /* delete the voc contxt */
    vocterm(&vocctx);

    /* delete the undo context */
    if (undoptr != 0)
        objuterm(undoptr);

    /* release the object cache structures */
    mcmcterm(mctx);
    mcmterm(globalctx);
}